

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O1

void FileWatcherRemoveAllWatches(HFileWatcher handle)

{
  long *plVar1;
  void *pvVar2;
  string *psVar3;
  uint uVar4;
  pointer pbVar5;
  ulong uVar6;
  long lVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RSI;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  long *plVar8;
  long *plVar9;
  size_type __n;
  string *psVar10;
  string *psVar11;
  
  uVar4 = pthread_mutex_lock((pthread_mutex_t *)((long)handle + 0x38));
  if (uVar4 != 0) {
    this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(ulong)uVar4;
    std::__throw_system_error(uVar4);
    if (in_RSI != this) {
      uVar6 = (long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (in_RSI + 8) -
              (long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)in_RSI;
      __n = (long)uVar6 >> 5;
      psVar10 = *(string **)this;
      if ((ulong)(*(long *)(this + 0x10) - (long)psVar10) < uVar6) {
        pbVar5 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_allocate_and_copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (this,__n,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       **)in_RSI,
                            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (in_RSI + 8));
        plVar1 = *(long **)(this + 8);
        if (*(long **)this != plVar1) {
          plVar8 = *(long **)this + 2;
          do {
            if (plVar8 != (long *)plVar8[-2]) {
              operator_delete((long *)plVar8[-2],*plVar8 + 1);
            }
            plVar9 = plVar8 + 2;
            plVar8 = plVar8 + 4;
          } while (plVar9 != plVar1);
        }
        pvVar2 = *(void **)this;
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,*(long *)(this + 0x10) - (long)pvVar2);
        }
        *(pointer *)this = pbVar5;
        *(ulong *)(this + 0x10) = (long)pbVar5 + uVar6;
      }
      else if ((ulong)(*(long *)(this + 8) - (long)psVar10) < uVar6) {
        lVar7 = *(long *)(this + 8) - (long)psVar10 >> 5;
        if (0 < lVar7) {
          lVar7 = lVar7 + 1;
          do {
            std::__cxx11::string::_M_assign(psVar10);
            psVar10 = psVar10 + 0x20;
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
        std::__uninitialized_copy<false>::__uninit_copy<std::__cxx11::string*,std::__cxx11::string*>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (this + 8) + (*(long *)in_RSI - *(long *)this)),
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (in_RSI + 8),
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)
                  );
      }
      else {
        if (0 < (long)__n) {
          lVar7 = __n + 1;
          do {
            std::__cxx11::string::_M_assign(psVar10);
            psVar10 = psVar10 + 0x20;
            lVar7 = lVar7 + -1;
          } while (1 < lVar7);
        }
        psVar3 = *(string **)(this + 8);
        if (psVar10 != psVar3) {
          psVar10 = psVar10 + 0x10;
          do {
            if (psVar10 != *(string **)(psVar10 + -0x10)) {
              operator_delete(*(string **)(psVar10 + -0x10),*(long *)psVar10 + 1);
            }
            psVar11 = psVar10 + 0x10;
            psVar10 = psVar10 + 0x20;
          } while (psVar11 != psVar3);
        }
      }
      *(ulong *)(this + 8) = uVar6 + *(long *)this;
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)handle + 0x10),*(pointer *)((long)handle + 0x10));
  pthread_mutex_unlock((pthread_mutex_t *)((long)handle + 0x38));
  return;
}

Assistant:

void FileWatcherRemoveAllWatches(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    watcher->Watches.clear();
}